

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O2

int X509_NAME_add_entry(X509_NAME *name,X509_NAME_ENTRY *ne,int loc,int set)

{
  OPENSSL_STACK *sk;
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  X509_NAME_ENTRY *a;
  size_t sVar4;
  int iVar5;
  bool bVar6;
  
  if (name == (X509_NAME *)0x0) {
    return 0;
  }
  sk = (OPENSSL_STACK *)name->entries;
  sVar2 = OPENSSL_sk_num(sk);
  iVar1 = (int)sVar2;
  iVar5 = loc;
  if (iVar1 < loc) {
    iVar5 = iVar1;
  }
  if (loc < 0) {
    iVar5 = iVar1;
  }
  bVar6 = set == 0;
  name->modified = 1;
  sVar2 = (size_t)iVar5;
  if (set == -1) {
    if (iVar5 != 0) {
      pvVar3 = OPENSSL_sk_value(sk,(long)(iVar5 + -1));
      iVar5 = *(int *)((long)pvVar3 + 0x10);
      bVar6 = false;
      goto LAB_0041a666;
    }
    bVar6 = true;
  }
  else {
    if (iVar5 < iVar1) {
      pvVar3 = OPENSSL_sk_value(sk,sVar2);
      iVar5 = *(int *)((long)pvVar3 + 0x10);
      goto LAB_0041a666;
    }
    if (iVar5 != 0) {
      pvVar3 = OPENSSL_sk_value(sk,(long)(iVar5 + -1));
      iVar5 = *(int *)((long)pvVar3 + 0x10) + 1;
      goto LAB_0041a666;
    }
  }
  iVar5 = 0;
LAB_0041a666:
  a = X509_NAME_ENTRY_dup(ne);
  iVar1 = 0;
  if (a != (X509_NAME_ENTRY *)0x0) {
    a->set = iVar5;
    sVar4 = OPENSSL_sk_insert(sk,a,sVar2);
    if (sVar4 == 0) {
      X509_NAME_ENTRY_free(a);
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
      if (bVar6) {
        sVar4 = OPENSSL_sk_num(sk);
        while (sVar2 = sVar2 + 1, (long)sVar2 < (long)(int)sVar4) {
          pvVar3 = OPENSSL_sk_value(sk,sVar2);
          *(int *)((long)pvVar3 + 0x10) = *(int *)((long)pvVar3 + 0x10) + 1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int X509_NAME_add_entry(X509_NAME *name, const X509_NAME_ENTRY *entry, int loc,
                        int set) {
  X509_NAME_ENTRY *new_name = NULL;
  int i, inc;
  STACK_OF(X509_NAME_ENTRY) *sk;

  if (name == NULL) {
    return 0;
  }
  sk = name->entries;
  int n = (int)sk_X509_NAME_ENTRY_num(sk);
  if (loc > n) {
    loc = n;
  } else if (loc < 0) {
    loc = n;
  }

  inc = (set == 0);
  name->modified = 1;

  if (set == -1) {
    if (loc == 0) {
      set = 0;
      inc = 1;
    } else {
      set = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set;
    }
  } else {  // if (set >= 0)

    if (loc >= n) {
      if (loc != 0) {
        set = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set + 1;
      } else {
        set = 0;
      }
    } else {
      set = sk_X509_NAME_ENTRY_value(sk, loc)->set;
    }
  }

  if ((new_name = X509_NAME_ENTRY_dup(entry)) == NULL) {
    goto err;
  }
  new_name->set = set;
  if (!sk_X509_NAME_ENTRY_insert(sk, new_name, loc)) {
    goto err;
  }
  if (inc) {
    n = (int)sk_X509_NAME_ENTRY_num(sk);
    for (i = loc + 1; i < n; i++) {
      sk_X509_NAME_ENTRY_value(sk, i)->set += 1;
    }
  }
  return 1;
err:
  if (new_name != NULL) {
    X509_NAME_ENTRY_free(new_name);
  }
  return 0;
}